

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall
duckdb::BaseAppender::AppendValueInternal<duckdb::interval_t>(BaseAppender *this,interval_t input)

{
  PhysicalType PVar1;
  data_ptr_t pdVar2;
  reference col;
  InvalidInputException *this_00;
  InternalException *this_01;
  vector<duckdb::LogicalType,_true> *pvVar3;
  long lVar4;
  string_t sVar5;
  interval_t value;
  Value local_70;
  
  value._0_8_ = input.micros;
  pvVar3 = &this->active_types;
  if ((this->active_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->active_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pvVar3 = &this->types;
  }
  if ((ulong)(((long)(pvVar3->
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar3->
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <=
      this->column) {
    this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_70.type_._0_8_ = (long)&local_70 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Too many appends for chunk!","");
    InvalidInputException::InvalidInputException(this_00,(string *)&local_70);
    __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  col = vector<duckdb::Vector,_true>::operator[](&(this->chunk).data,this->column);
  value.micros = &switchD_016c5baf::switchdataD_01e40838;
  switch((col->type).id_) {
  case BOOLEAN:
    AppendValueInternal<duckdb::interval_t,bool>(this,col,input);
    break;
  case TINYINT:
    AppendValueInternal<duckdb::interval_t,signed_char>(this,col,input);
    break;
  case SMALLINT:
    AppendValueInternal<duckdb::interval_t,short>(this,col,input);
    break;
  case INTEGER:
    AppendValueInternal<duckdb::interval_t,int>(this,col,input);
    break;
  case BIGINT:
    AppendValueInternal<duckdb::interval_t,long>(this,col,input);
    break;
  case DATE:
    AppendValueInternal<duckdb::interval_t,duckdb::date_t>(this,col,input);
    break;
  case TIME:
    AppendValueInternal<duckdb::interval_t,duckdb::dtime_t>(this,col,input);
    break;
  default:
    Value::CreateValue<duckdb::interval_t>(&local_70,input._0_8_,value);
    DataChunk::SetValue(&this->chunk,this->column,(this->chunk).count,&local_70);
    this->column = this->column + 1;
    Value::~Value(&local_70);
    return;
  case TIMESTAMP:
  case TIMESTAMP_TZ:
    AppendValueInternal<duckdb::interval_t,duckdb::timestamp_t>(this,col,input);
    break;
  case DECIMAL:
    PVar1 = (col->type).physical_type_;
    if (PVar1 < INT64) {
      if (PVar1 == INT16) {
        AppendDecimalValueInternal<duckdb::interval_t,short>(this,col,input);
      }
      else {
        if (PVar1 != INT32) {
LAB_016c5e7c:
          this_01 = (InternalException *)__cxa_allocate_exception(0x10);
          local_70.type_._0_8_ = (long)&local_70 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"Internal type not recognized for Decimal","");
          InternalException::InternalException(this_01,(string *)&local_70);
          __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        AppendDecimalValueInternal<duckdb::interval_t,int>(this,col,input);
      }
    }
    else if (PVar1 == INT64) {
      AppendDecimalValueInternal<duckdb::interval_t,long>(this,col,input);
    }
    else {
      if (PVar1 != INT128) goto LAB_016c5e7c;
      AppendDecimalValueInternal<duckdb::interval_t,duckdb::hugeint_t>(this,col,input);
    }
    break;
  case FLOAT:
    AppendValueInternal<duckdb::interval_t,float>(this,col,input);
    break;
  case DOUBLE:
    AppendValueInternal<duckdb::interval_t,double>(this,col,input);
    break;
  case VARCHAR:
    sVar5 = StringCast::Operation<duckdb::interval_t>(input,col);
    pdVar2 = col->data;
    lVar4 = (this->chunk).count * 0x10;
    *(long *)(pdVar2 + lVar4) = sVar5.value._0_8_;
    *(long *)(pdVar2 + lVar4 + 8) = sVar5.value._8_8_;
    break;
  case INTERVAL:
    AppendValueInternal<duckdb::interval_t,duckdb::interval_t>(this,col,input);
    break;
  case UTINYINT:
    AppendValueInternal<duckdb::interval_t,unsigned_char>(this,col,input);
    break;
  case USMALLINT:
    AppendValueInternal<duckdb::interval_t,unsigned_short>(this,col,input);
    break;
  case UINTEGER:
    AppendValueInternal<duckdb::interval_t,unsigned_int>(this,col,input);
    break;
  case UBIGINT:
    AppendValueInternal<duckdb::interval_t,unsigned_long>(this,col,input);
    break;
  case TIME_TZ:
    AppendValueInternal<duckdb::interval_t,duckdb::dtime_tz_t>(this,col,input);
    break;
  case UHUGEINT:
    AppendValueInternal<duckdb::interval_t,duckdb::uhugeint_t>(this,col,input);
    break;
  case HUGEINT:
    AppendValueInternal<duckdb::interval_t,duckdb::hugeint_t>(this,col,input);
  }
  this->column = this->column + 1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(T input) {
	if (column >= GetActiveTypes().size()) {
		throw InvalidInputException("Too many appends for chunk!");
	}
	auto &col = chunk.data[column];
	switch (col.GetType().id()) {
	case LogicalTypeId::BOOLEAN:
		AppendValueInternal<T, bool>(col, input);
		break;
	case LogicalTypeId::UTINYINT:
		AppendValueInternal<T, uint8_t>(col, input);
		break;
	case LogicalTypeId::TINYINT:
		AppendValueInternal<T, int8_t>(col, input);
		break;
	case LogicalTypeId::USMALLINT:
		AppendValueInternal<T, uint16_t>(col, input);
		break;
	case LogicalTypeId::SMALLINT:
		AppendValueInternal<T, int16_t>(col, input);
		break;
	case LogicalTypeId::UINTEGER:
		AppendValueInternal<T, uint32_t>(col, input);
		break;
	case LogicalTypeId::INTEGER:
		AppendValueInternal<T, int32_t>(col, input);
		break;
	case LogicalTypeId::UBIGINT:
		AppendValueInternal<T, uint64_t>(col, input);
		break;
	case LogicalTypeId::BIGINT:
		AppendValueInternal<T, int64_t>(col, input);
		break;
	case LogicalTypeId::HUGEINT:
		AppendValueInternal<T, hugeint_t>(col, input);
		break;
	case LogicalTypeId::UHUGEINT:
		AppendValueInternal<T, uhugeint_t>(col, input);
		break;
	case LogicalTypeId::FLOAT:
		AppendValueInternal<T, float>(col, input);
		break;
	case LogicalTypeId::DOUBLE:
		AppendValueInternal<T, double>(col, input);
		break;
	case LogicalTypeId::DECIMAL:
		switch (col.GetType().InternalType()) {
		case PhysicalType::INT16:
			AppendDecimalValueInternal<T, int16_t>(col, input);
			break;
		case PhysicalType::INT32:
			AppendDecimalValueInternal<T, int32_t>(col, input);
			break;
		case PhysicalType::INT64:
			AppendDecimalValueInternal<T, int64_t>(col, input);
			break;
		case PhysicalType::INT128:
			AppendDecimalValueInternal<T, hugeint_t>(col, input);
			break;
		default:
			throw InternalException("Internal type not recognized for Decimal");
		}
		break;
	case LogicalTypeId::DATE:
		AppendValueInternal<T, date_t>(col, input);
		break;
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ:
		AppendValueInternal<T, timestamp_t>(col, input);
		break;
	case LogicalTypeId::TIME:
		AppendValueInternal<T, dtime_t>(col, input);
		break;
	case LogicalTypeId::TIME_TZ:
		AppendValueInternal<T, dtime_tz_t>(col, input);
		break;
	case LogicalTypeId::INTERVAL:
		AppendValueInternal<T, interval_t>(col, input);
		break;
	case LogicalTypeId::VARCHAR:
		FlatVector::GetData<string_t>(col)[chunk.size()] = StringCast::Operation<T>(input, col);
		break;
	default:
		AppendValue(Value::CreateValue<T>(input));
		return;
	}
	column++;
}